

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlDependence.h
# Opt level: O1

ValVec * __thiscall
dg::LLVMControlDependenceAnalysis::_getDependencies<llvm::Instruction_const*>
          (ValVec *__return_storage_ptr__,LLVMControlDependenceAnalysis *this,Instruction *v)

{
  LLVMControlDependenceAnalysisImpl *pLVar1;
  ValVec interproc;
  void *local_30;
  undefined8 local_28;
  long local_20;
  
  (*((this->_impl)._M_t.
     super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
     ._M_t.
     super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
     .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>._M_head_impl)->
    _vptr_LLVMControlDependenceAnalysisImpl[5])();
  if ((this->_options).super_ControlDependenceAnalysisOptions.interprocedural == true) {
    pLVar1 = (this->_interprocImpl)._M_t.
             super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysisImpl,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_std::default_delete<dg::LLVMControlDependenceAnalysisImpl>_>
             .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false>._M_head_impl;
    (*pLVar1->_vptr_LLVMControlDependenceAnalysisImpl[5])(&local_30,pLVar1,v);
    std::vector<llvm::Value*,std::allocator<llvm::Value*>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<llvm::Value**,std::vector<llvm::Value*,std::allocator<llvm::Value*>>>>
              ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>)._M_impl.
               super__Vector_impl_data._M_finish,local_30,local_28);
    if (local_30 != (void *)0x0) {
      operator_delete(local_30,local_20 - (long)local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ValVec _getDependencies(ValT v) {
        assert(_impl);
        auto ret = _impl->getDependencies(v);

        if (getOptions().interproceduralCD()) {
            assert(_interprocImpl);
            auto interproc = _interprocImpl->getDependencies(v);
            ret.insert(ret.end(), interproc.begin(), interproc.end());
        }
        return ret;
    }